

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::enforceNoDuplicateTestCases
               (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *functions)

{
  bool bVar1;
  reference __x;
  ostream *poVar2;
  pointer pTVar3;
  pointer this;
  TestCaseInfo *pTVar4;
  runtime_error *this_00;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> pVar5;
  string local_220 [39];
  Colour local_1f9;
  ostringstream local_1f8 [8];
  ostringstream ss;
  _Rb_tree_const_iterator<Catch::TestCase> local_60;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> prev;
  const_iterator itEnd;
  const_iterator it;
  set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> seenFunctions;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *functions_local;
  
  std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::set
            ((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_> *)
             &it);
  itEnd = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin(functions);
  prev._8_8_ = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(functions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&itEnd,(__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                               *)&prev.second);
    if (!bVar1) {
      std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::~set
                ((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                  *)&it);
      return;
    }
    __x = __gnu_cxx::
          __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
          ::operator*(&itEnd);
    pVar5 = std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
            ::insert((set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
                      *)&it,__x);
    local_60 = pVar5.first._M_node;
    prev.first._M_node._0_1_ = pVar5.second;
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&itEnd);
  }
  std::__cxx11::ostringstream::ostringstream(local_1f8);
  Colour::Colour(&local_1f9,Red);
  poVar2 = operator<<((ostream *)local_1f8,&local_1f9);
  poVar2 = std::operator<<(poVar2,"error: TEST_CASE( \"");
  pTVar3 = __gnu_cxx::
           __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
           ::operator->(&itEnd);
  poVar2 = std::operator<<(poVar2,(string *)pTVar3);
  poVar2 = std::operator<<(poVar2,"\" ) already defined.\n");
  poVar2 = std::operator<<(poVar2,"\tFirst seen at ");
  this = std::_Rb_tree_const_iterator<Catch::TestCase>::operator->(&local_60);
  pTVar4 = TestCase::getTestCaseInfo(this);
  poVar2 = operator<<(poVar2,&pTVar4->lineInfo);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tRedefined at ");
  pTVar3 = __gnu_cxx::
           __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
           ::operator->(&itEnd);
  pTVar4 = TestCase::getTestCaseInfo(pTVar3);
  poVar2 = operator<<(poVar2,&pTVar4->lineInfo);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Colour::~Colour(&local_1f9);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_220);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void enforceNoDuplicateTestCases( std::vector<TestCase> const& functions ) {
        std::set<TestCase> seenFunctions;
        for( std::vector<TestCase>::const_iterator it = functions.begin(), itEnd = functions.end();
            it != itEnd;
            ++it ) {
            std::pair<std::set<TestCase>::const_iterator, bool> prev = seenFunctions.insert( *it );
            if( !prev.second ) {
                std::ostringstream ss;

                ss  << Colour( Colour::Red )
                    << "error: TEST_CASE( \"" << it->name << "\" ) already defined.\n"
                    << "\tFirst seen at " << prev.first->getTestCaseInfo().lineInfo << "\n"
                    << "\tRedefined at " << it->getTestCaseInfo().lineInfo << std::endl;

                throw std::runtime_error(ss.str());
            }
        }
    }